

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::OurReader::readObject(OurReader *this,Token *token)

{
  TokenType TVar1;
  bool bVar2;
  _Elt_pointer ppVVar3;
  allocator<char> local_f1;
  Value numberName;
  String name;
  Token colon;
  Token comma;
  Token tokenName;
  Value init;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  Value::Value(&init,objectValue);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::swapPayload(ppVVar3[-1],&init);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::setOffsetStart(ppVVar3[-1],(long)token->start_ - (long)this->begin_);
  do {
    bVar2 = readToken(this,&tokenName);
    if (!bVar2) {
LAB_004ef77a:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numberName,"Missing \'}\' or object member name",
                 (allocator<char> *)&colon);
      addErrorAndRecover(this,(String *)&numberName,&tokenName,tokenObjectEnd);
LAB_004ef842:
      std::__cxx11::string::~string((string *)&numberName);
LAB_004ef84c:
      bVar2 = false;
      goto LAB_004ef84e;
    }
    bVar2 = true;
    while ((TVar1 = tokenName.type_, bVar2 != false && (tokenName.type_ == tokenComment))) {
      bVar2 = readToken(this,&tokenName);
    }
    if (bVar2 == false) goto LAB_004ef77a;
    if (tokenName.type_ == tokenObjectEnd) {
      bVar2 = true;
      if ((name._M_string_length != 0) && ((this->features_).allowTrailingCommas_ == false)) {
        name._M_string_length = 0;
        *name._M_dataplus._M_p = '\0';
        goto LAB_004ef77a;
      }
      goto LAB_004ef84e;
    }
    name._M_string_length = 0;
    *name._M_dataplus._M_p = '\0';
    if (TVar1 == tokenNumber) {
      if ((this->features_).allowNumericKeys_ != true) goto LAB_004ef77a;
      Value::Value(&numberName,nullValue);
      bVar2 = decodeNumber(this,&tokenName,&numberName);
      if (bVar2) {
        Value::asString_abi_cxx11_((String *)&colon,&numberName);
        std::__cxx11::string::operator=((string *)&name,(string *)&colon);
        std::__cxx11::string::~string((string *)&colon);
      }
      else {
        recoverFromError(this,tokenObjectEnd);
      }
      Value::~Value(&numberName);
      if (bVar2) goto LAB_004ef618;
      goto LAB_004ef84c;
    }
    if (TVar1 != tokenString) goto LAB_004ef77a;
    bVar2 = decodeString(this,&tokenName,&name);
    if (!bVar2) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_004ef84c;
    }
LAB_004ef618:
    if (0x3fffffff < name._M_string_length) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numberName,"keylength >= 2^30",(allocator<char> *)&colon);
      throwRuntimeError((String *)&numberName);
    }
    if ((this->features_).rejectDupKeys_ == true) {
      ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar3 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      bVar2 = Value::isMember(ppVVar3[-1],&name);
      if (!bVar2) goto LAB_004ef660;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colon,
                     "Duplicate key: \'",&name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numberName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colon,
                     "\'");
      std::__cxx11::string::~string((string *)&colon);
      addErrorAndRecover(this,(String *)&numberName,&tokenName,tokenObjectEnd);
      goto LAB_004ef842;
    }
LAB_004ef660:
    bVar2 = readToken(this,&colon);
    if (!bVar2 || colon.type_ != tokenMemberSeparator) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numberName,"Missing \':\' after object member name",
                 (allocator<char> *)&comma);
      addErrorAndRecover(this,(String *)&numberName,&colon,tokenObjectEnd);
      goto LAB_004ef842;
    }
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar3 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    numberName.value_.map_ = (ObjectValues *)Value::operator[](ppVVar3[-1],&name);
    std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
              ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&numberName);
    bVar2 = readValue(this);
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
    if (!bVar2) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_004ef84c;
    }
    bVar2 = readToken(this,&comma);
    if (((!bVar2) || (tokenComment < comma.type_)) ||
       ((0xa004U >> (comma.type_ & (tokenError|tokenComment)) & 1) == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numberName,"Missing \',\' or \'}\' in object declaration",&local_f1);
      addErrorAndRecover(this,(String *)&numberName,&comma,tokenObjectEnd);
      goto LAB_004ef842;
    }
    bVar2 = true;
    while ((bVar2 != false && (comma.type_ == tokenComment))) {
      bVar2 = readToken(this,&comma);
    }
  } while (comma.type_ != tokenObjectEnd);
  bVar2 = true;
LAB_004ef84e:
  Value::~Value(&init);
  std::__cxx11::string::~string((string *)&name);
  return bVar2;
}

Assistant:

bool OurReader::readObject(Token& token) {
  Token tokenName;
  String name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(token.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd &&
        (name.empty() ||
         features_.allowTrailingCommas_)) // empty object or trailing comma
      return true;
    name.clear();
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }
    if (name.length() >= (1U << 30))
      throwRuntimeError("keylength >= 2^30");
    if (features_.rejectDupKeys_ && currentValue().isMember(name)) {
      String msg = "Duplicate key: '" + name + "'";
      return addErrorAndRecover(msg, tokenName, tokenObjectEnd);
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover("Missing ':' after object member name", colon,
                                tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover("Missing ',' or '}' in object declaration",
                                comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover("Missing '}' or object member name", tokenName,
                            tokenObjectEnd);
}